

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

bool __thiscall DMenu::MouseEventBack(DMenu *this,int type,int x,int y)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  FTexture *this_00;
  
  if (m_show_backbutton.Value < 0) {
    bVar1 = 0;
  }
  else {
    this_00 = FTextureManager::operator()(&TexMan,gameinfo.mBackButton.Chars);
    if (this_00 == (FTexture *)0x0) {
      bVar1 = 0;
    }
    else {
      if ((m_show_backbutton.Value & 1U) != 0) {
        iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        iVar2 = FTexture::GetScaledWidth(this_00);
        x = (x - iVar3) + iVar2 * CleanXfac;
      }
      if ((m_show_backbutton.Value & 2U) != 0) {
        iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
        iVar2 = FTexture::GetScaledHeight(this_00);
        y = (y - iVar3) + iVar2 * CleanYfac;
      }
      if (x < 0) {
        bVar1 = false;
      }
      else {
        iVar3 = FTexture::GetScaledWidth(this_00);
        bVar1 = false;
        if ((x < iVar3 * CleanXfac) && (-1 < y)) {
          iVar3 = FTexture::GetScaledHeight(this_00);
          bVar1 = y < iVar3 * CleanYfac;
        }
      }
      (this->super_DObject).field_0x25 = bVar1;
      if ((type == 2) && ((bool)bVar1 != false)) {
        if (m_use_mouse.Value == 2) {
          (this->super_DObject).field_0x25 = 0;
        }
        (*(this->super_DObject)._vptr_DObject[8])(this,7,1);
        bVar1 = (this->super_DObject).field_0x25;
      }
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool DMenu::MouseEventBack(int type, int x, int y)
{
	if (m_show_backbutton >= 0)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		if (tex != NULL)
		{
			if (m_show_backbutton&1) x -= screen->GetWidth() - tex->GetScaledWidth() * CleanXfac;
			if (m_show_backbutton&2) y -= screen->GetHeight() - tex->GetScaledHeight() * CleanYfac;
			mBackbuttonSelected = ( x >= 0 && x < tex->GetScaledWidth() * CleanXfac && 
									y >= 0 && y < tex->GetScaledHeight() * CleanYfac);
			if (mBackbuttonSelected && type == MOUSE_Release)
			{
				if (m_use_mouse == 2) mBackbuttonSelected = false;
				MenuEvent(MKEY_Back, true);
			}
			return mBackbuttonSelected;
		}
	}
	return false;
}